

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonDom.cc
# Opt level: O2

string * __thiscall
avro::json::Entity::toString_abi_cxx11_(string *__return_storage_ptr__,Entity *this)

{
  char cVar1;
  long lVar2;
  auto_ptr<avro::OutputStream> out;
  size_t n;
  auto_ptr<avro::InputStream> in2;
  auto_ptr<avro::InputStream> in;
  uint8_t *p;
  JsonGenerator g;
  OutputStream *local_b8;
  size_t local_b0;
  long *local_a8;
  long *local_a0;
  void *local_98;
  JsonGenerator local_90;
  
  memoryOutputStream((avro *)&local_b8,0x1000);
  JsonGenerator::JsonGenerator(&local_90);
  StreamWriter::reset(&local_90.out_,local_b8);
  writeEntity(&local_90,this);
  StreamWriter::flush(&local_90.out_);
  memoryInputStream((avro *)&local_a0,local_b8);
  local_98 = (void *)0x0;
  local_b0 = 0;
  do {
    cVar1 = (**(code **)(*local_a0 + 0x10))(local_a0,&local_98,&local_b0);
  } while (cVar1 != '\0');
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)__return_storage_ptr__);
  memoryInputStream((avro *)&local_a8,local_b8);
  lVar2 = 0;
  while (cVar1 = (**(code **)(*local_a8 + 0x10))(local_a8,&local_98,&local_b0), cVar1 != '\0') {
    memcpy((__return_storage_ptr__->_M_dataplus)._M_p + lVar2,local_98,local_b0);
    lVar2 = lVar2 + local_b0;
  }
  if (local_a8 != (long *)0x0) {
    (**(code **)(*local_a8 + 8))();
  }
  if (local_a0 != (long *)0x0) {
    (**(code **)(*local_a0 + 8))();
  }
  std::
  _Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>::
  ~_Deque_base((_Deque_base<avro::json::JsonGenerator::State,_std::allocator<avro::json::JsonGenerator::State>_>
                *)&local_90.stateStack);
  if (local_b8 != (OutputStream *)0x0) {
    (*local_b8->_vptr_OutputStream[1])();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Entity::toString() const
{
    std::auto_ptr<OutputStream> out = memoryOutputStream();
    JsonGenerator g;
    g.init(*out);
    writeEntity(g, *this);
    g.flush();
    std::auto_ptr<InputStream> in = memoryInputStream(*out);
    const uint8_t *p = 0;
    size_t n = 0;
    size_t c = 0;
    while (in->next(&p, &n)) {
        c += n;
    }
    std::string result;
    result.resize(c);
    c = 0;
    std::auto_ptr<InputStream> in2 = memoryInputStream(*out);
    while (in2->next(&p, &n)) {
        ::memcpy(&result[c], p, n);
        c += n;
    }
    return result;
}